

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void CorUnix::CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress
               (CPalThread *pthrCurrent,WaitingThreadsListNode *pwtlnNode)

{
  uint uVar1;
  int iVar2;
  _ThreadWaitInfo *p_Var3;
  bool bVar4;
  bool fTargetObjectIsShared;
  bool fSharedSynchLock;
  ThreadWaitInfo *ptwiWaitInfo;
  int iTgtCount;
  int i;
  WaitingThreadsListNode *pwtlnNode_local;
  CPalThread *pthrCurrent_local;
  
  bVar4 = false;
  uVar1 = pwtlnNode->dwFlags;
  if (gPID != pwtlnNode->dwProcessId) {
    fprintf(_stderr,"] %s %s:%d","MarkWaitForDelegatedObjectSignalingInProgress",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb0a);
    fprintf(_stderr,
            "Expression: gPID == pwtlnNode->dwProcessId, Description: MarkWaitForDelegatedObjectSignalingInProgress() called from the wrong process"
           );
  }
  p_Var3 = pwtlnNode->ptwiWaitInfo;
  if (((uVar1 & 1) == 0) && (p_Var3->wdWaitDomain != LocalWait)) {
    AcquireSharedSynchLock(pthrCurrent);
    bVar4 = true;
  }
  if (p_Var3->wtWaitType != MultipleObjectsWaitAll) {
    fprintf(_stderr,"] %s %s:%d","MarkWaitForDelegatedObjectSignalingInProgress",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb17);
    fprintf(_stderr,
            "Expression: MultipleObjectsWaitAll == ptwiWaitInfo->wtWaitType, Description: MarkWaitForDelegatedObjectSignalingInProgress() called on a normal (non wait-all) wait"
           );
  }
  iVar2 = p_Var3->lObjCount;
  for (ptwiWaitInfo._4_4_ = 0; ptwiWaitInfo._4_4_ < iVar2;
      ptwiWaitInfo._4_4_ = ptwiWaitInfo._4_4_ + 1) {
    p_Var3->rgpWTLNodes[ptwiWaitInfo._4_4_]->dwFlags =
         p_Var3->rgpWTLNodes[ptwiWaitInfo._4_4_]->dwFlags & 0xfffffffb;
  }
  pwtlnNode->dwFlags = pwtlnNode->dwFlags | 4;
  if (bVar4) {
    ReleaseSharedSynchLock(pthrCurrent);
  }
  return;
}

Assistant:

void CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress(
        CPalThread * pthrCurrent,
        WaitingThreadsListNode * pwtlnNode)
    {
        int i, iTgtCount;
        ThreadWaitInfo * ptwiWaitInfo = NULL;
        bool fSharedSynchLock = false;
        bool fTargetObjectIsShared =
            (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags));

        VALIDATEOBJECT(pwtlnNode);

        _ASSERT_MSG(gPID == pwtlnNode->dwProcessId,
                    "MarkWaitForDelegatedObjectSignalingInProgress() called "
                    "from the wrong process");

        ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;

        if (!fSharedSynchLock && !fTargetObjectIsShared &&
            LocalWait != ptwiWaitInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        _ASSERT_MSG(MultipleObjectsWaitAll == ptwiWaitInfo->wtWaitType,
                    "MarkWaitForDelegatedObjectSignalingInProgress() called "
                    "on a normal (non wait-all) wait");

        // Unmark all node other than the target one
        iTgtCount = ptwiWaitInfo->lObjCount;
        for (i=0; i < iTgtCount; i++)
        {
            VALIDATEOBJECT(ptwiWaitInfo->rgpWTLNodes[i]);

            ptwiWaitInfo->rgpWTLNodes[i]->dwFlags &=
                ~WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;
        }

        // Mark the target node
        pwtlnNode->dwFlags |= WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;

        // Done
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        return;
    }